

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

int __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::size(FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
       *this)

{
  int *piVar1;
  int rsz;
  int lsz;
  int local_10;
  int local_c [3];
  
  local_c[0] = FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
               ::size((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                       *)0x1859a0a);
  local_10 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::size
                       ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x1859a1d);
  piVar1 = std::max<int>(local_c,&local_10);
  return *piVar1;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }